

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_cluster_client_sender(void *m_,intptr_t ignr_)

{
  long *plVar1;
  long lVar2;
  fio_defer_task_s task;
  fio_write_args_s options;
  intptr_t uuid;
  uint uVar3;
  long lVar4;
  void *local_78;
  code *pcStack_70;
  long local_68;
  long lStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  uuid = cluster_data.uuid;
  if ((((cluster_data.uuid < 0) ||
       (uVar3 = (uint)((ulong)cluster_data.uuid >> 8), fio_data->capa <= uVar3)) ||
      (*(char *)((long)fio_data + (long)(int)uVar3 * 0xa8 + 0x6d) != (char)cluster_data.uuid)) &&
     (fio_data->active != '\0')) {
    task.arg1 = m_;
    task.func = fio_cluster_client_sender;
    task.arg2 = (void *)ignr_;
    fio_defer_push_task_fn(task,&task_queue_normal);
    return;
  }
  LOCK();
  *(long *)((long)m_ + 0x30) = *(long *)((long)m_ + 0x30) + 1;
  UNLOCK();
  pcStack_70 = fio_msg_internal_free2;
  local_68 = *(long *)((long)m_ + 0x20) + 0x12 + *(long *)((long)m_ + 8);
  lStack_60 = *(long *)((long)m_ + 0x40) * 0x18 + 0x48;
  local_58 = local_58 & 0xfffffffffffffff0;
  options.after.dealloc = fio_msg_internal_free2;
  options.data.buffer = m_;
  options.length = local_68;
  options.offset = lStack_60;
  options._32_8_ = local_58;
  local_78 = m_;
  fio_write2_fn(uuid,options);
  LOCK();
  plVar1 = (long *)((long)m_ + 0x30);
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    lVar4 = *(long *)((long)m_ + 0x40);
    if (lVar4 != 0) {
      do {
        lVar2 = lVar4 + -1;
        *(long *)((long)m_ + 0x40) = lVar2;
        if (*(long *)((long)m_ + lVar4 * 0x18 + 0x38) != 0) {
          local_78 = (void *)((ulong)local_78 & 0xffffffff00000000);
          lStack_60 = *(long *)((long)m_ + 0x10);
          pcStack_70 = *m_;
          local_68 = *(long *)((long)m_ + 8);
          local_48 = *(undefined8 *)((long)m_ + 0x28);
          local_58 = *(ulong *)((long)m_ + 0x18);
          uStack_50 = *(undefined8 *)((long)m_ + 0x20);
          local_40 = 0;
          uStack_38 = 0;
          local_30 = 0;
          (**(code **)((long)m_ + lVar2 * 0x18 + 0x50))
                    (&local_78,*(undefined8 *)((long)m_ + lVar2 * 0x18 + 0x58));
        }
        lVar4 = *(long *)((long)m_ + 0x40);
      } while (lVar4 != 0);
    }
    fio_free(m_);
  }
  return;
}

Assistant:

static void fio_cluster_client_sender(void *m_, intptr_t ignr_) {
  fio_msg_internal_s *m = m_;
  if (!uuid_is_valid(cluster_data.uuid) && fio_data->active) {
    /* delay message delivery until we have a vaild uuid */
    fio_defer_push_task((void (*)(void *, void *))fio_cluster_client_sender, m_,
                        (void *)ignr_);
    return;
  }
  fio_msg_internal_send_dup(cluster_data.uuid, m);
  fio_msg_internal_free(m);
}